

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<BoolView>::~vec(vec<BoolView> *this)

{
  uint *in_RDI;
  uint i;
  uint local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    (**(code **)(*(long *)(*(long *)(in_RDI + 2) + (ulong)local_c * 0x10) + 0x28))();
  }
  if (*(long *)(in_RDI + 2) != 0) {
    free(*(void **)(in_RDI + 2));
  }
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}